

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O1

Bool ShouldIndent(TidyDocImpl *doc,Node *node)

{
  int iVar1;
  Dict *pDVar2;
  Bool BVar3;
  Bool BVar4;
  Node *node_00;
  
  iVar1 = *(int *)((doc->config).value + 0x25);
  BVar3 = no;
  if ((iVar1 != 0) && ((node->tag == (Dict *)0x0 || (node->tag->id != TidyTag_TEXTAREA)))) {
    if (iVar1 == 2) {
      if ((node->content != (Node *)0x0) && (BVar3 = prvTidynodeHasCM(node,0x40000), BVar3 != no)) {
        node_00 = node->content;
        while( true ) {
          if (node_00 == (Node *)0x0) {
            return no;
          }
          BVar3 = prvTidynodeHasCM(node_00,8);
          if (BVar3 != no) break;
          node_00 = node_00->next;
        }
        return yes;
      }
      BVar3 = prvTidynodeHasCM(node,0x4000);
      if (BVar3 != no) {
        return no;
      }
      pDVar2 = node->tag;
      if (pDVar2 != (Dict *)0x0) {
        if (pDVar2->id == TidyTag_HTML) {
          return no;
        }
        if (pDVar2 != (Dict *)0x0) {
          if (pDVar2->id == TidyTag_P) {
            return no;
          }
          if (pDVar2 != (Dict *)0x0) {
            if (pDVar2->id == TidyTag_TITLE) {
              return no;
            }
            if ((((pDVar2 != (Dict *)0x0) && (pDVar2->id == TidyTag_DIV)) &&
                (node->last != (Node *)0x0)) &&
               ((pDVar2 = node->last->tag, pDVar2 != (Dict *)0x0 && (pDVar2->id == TidyTag_IMG)))) {
              return no;
            }
          }
        }
      }
    }
    BVar4 = prvTidynodeHasCM(node,0xc00);
    BVar3 = yes;
    if ((BVar4 == no) && ((node->tag == (Dict *)0x0 || (node->tag->id != TidyTag_MAP)))) {
      BVar4 = prvTidynodeHasCM(node,0x10);
      BVar3 = no;
      if (BVar4 == no) {
        BVar3 = (Bool)(node->content != (Node *)0x0);
      }
    }
  }
  return BVar3;
}

Assistant:

static Bool ShouldIndent( TidyDocImpl* doc, Node *node )
{
    TidyTriState indentContent = cfgAutoBool( doc, TidyIndentContent );
    if ( indentContent == TidyNoState )
        return no;

    if ( nodeIsTEXTAREA(node) )
        return no;

    if ( indentContent == TidyAutoState )
    {
        if ( node->content && TY_(nodeHasCM)(node, CM_NO_INDENT) )
        {
            for ( node = node->content; node; node = node->next )
                if ( TY_(nodeHasCM)(node, CM_BLOCK) )
                    return yes;
            return no;
        }

        if ( TY_(nodeHasCM)(node, CM_HEADING) )
            return no;

        if ( nodeIsHTML(node) )
            return no;

        if ( nodeIsP(node) )
            return no;

        if ( nodeIsTITLE(node) )
            return no;

        /* http://tidy.sf.net/issue/1610888
           Indenting <div><img /></div> produces spurious lines with IE 6.x */
        if ( nodeIsDIV(node) && node->last && nodeIsIMG(node->last) )
            return no;
    }

    if ( TY_(nodeHasCM)(node, CM_FIELD | CM_OBJECT) )
        return yes;

    if ( nodeIsMAP(node) )
        return yes;

    return ( !TY_(nodeHasCM)( node, CM_INLINE ) && node->content );
}